

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * string_proper(char *argument)

{
  byte *pbVar1;
  byte bVar2;
  char *pcVar3;
  byte bVar4;
  char *s;
  
  pcVar3 = argument;
  while( true ) {
    while( true ) {
      bVar2 = *argument;
      if (bVar2 != 0x20) break;
      argument = (char *)((byte *)argument + 1);
    }
    if (bVar2 == 0) break;
    bVar4 = bVar2 - 0x20;
    if (0x19 < (byte)(bVar2 + 0x9f)) {
      bVar4 = bVar2;
    }
    *argument = bVar4;
    while ((bVar4 & 0xdf) != 0) {
      pbVar1 = (byte *)argument + 1;
      argument = (char *)((byte *)argument + 1);
      bVar4 = *pbVar1;
    }
  }
  return pcVar3;
}

Assistant:

char *string_proper(char *argument)
{
	char *s;

	s = argument;

	while (*s != '\0')
	{
		if (*s != ' ')
		{
			*s = UPPER(*s);

			while (*s != ' ' && *s != '\0')
			{
				s++;
			}
		}
		else
		{
			s++;
		}
	}

	return argument;
}